

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall booster::locale::date_time::date_time(date_time *this)

{
  calendar_facet *pcVar1;
  abstract_calendar *paVar2;
  locale local_30 [4];
  
  std::locale::locale(local_30);
  pcVar1 = std::use_facet<booster::locale::calendar_facet>(local_30);
  paVar2 = (abstract_calendar *)(**(code **)(*(long *)pcVar1 + 0x10))(pcVar1);
  (this->impl_).ptr_ = paVar2;
  std::locale::~locale(local_30);
  paVar2 = (this->impl_).ptr_;
  time_zone::global_abi_cxx11_();
  (*paVar2->_vptr_abstract_calendar[10])(paVar2,local_30);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

date_time::date_time() :
    impl_(std::use_facet<calendar_facet>(std::locale()).create_calendar())
{
    impl_->set_timezone(time_zone::global());
}